

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  U32 *pUVar1;
  HUF_DTable *pHVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  U32 UVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  HUF_DTable *pHVar14;
  ulong uVar15;
  U32 tableLog_00;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  U32 nbBits;
  size_t sVar22;
  int local_e0;
  U32 nbSymbols;
  U32 tableLog;
  HUF_DTable *local_a8;
  HUF_DTable *local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  HUF_DTable *local_70;
  ulong local_68;
  void *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  if (wkspSize < 0x84c) {
    sVar22 = 0xffffffffffffffff;
  }
  else {
    uVar3 = *DTable;
    tableLog_00 = uVar3 & 0xff;
    *(undefined8 *)((long)workSpace + 0x2d0) = 0;
    *(undefined8 *)((long)workSpace + 0x2d8) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    *(undefined8 *)((long)workSpace + 0x270) = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    sVar22 = 0xffffffffffffffd4;
    if (tableLog_00 < 0xd) {
      local_90 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x3e0),0x100,
                                    (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,
                                    srcSize,(void *)((long)workSpace + 0x4e0),0x36c,flags);
      sVar22 = local_90;
      if ((local_90 < 0xffffffffffffff89) &&
         (local_78 = (ulong)tableLog, sVar22 = 0xffffffffffffffd4, tableLog <= tableLog_00)) {
        local_a0 = DTable + 1;
        uVar17 = 0;
        uVar15 = local_78;
        do {
          uVar17 = uVar17 + 1;
          pUVar1 = (U32 *)((long)workSpace + 0x270) + uVar15;
          uVar15 = (ulong)((int)uVar15 - 1);
        } while (*pUVar1 == 0);
        uVar9 = (tableLog - uVar17) + 2;
        uVar15 = (ulong)uVar9;
        iVar11 = (tableLog - uVar17) + 1;
        iVar8 = 0;
        for (lVar12 = 0x9d; lVar12 - 0x9cU < uVar15; lVar12 = lVar12 + 1) {
          iVar6 = *(int *)((long)workSpace + lVar12 * 4);
          *(int *)((long)workSpace + lVar12 * 4 + 0x38) = iVar8;
          iVar8 = iVar6 + iVar8;
        }
        *(int *)((long)workSpace + 0x2a8) = iVar8;
        *(int *)((long)workSpace + uVar15 * 4 + 0x2a8) = iVar8;
        for (uVar18 = 0; nbSymbols != uVar18; uVar18 = uVar18 + 1) {
          uVar19 = (ulong)*(byte *)((long)workSpace + uVar18 + 0x3e0);
          uVar7 = *(uint *)((long)workSpace + uVar19 * 4 + 0x2a8);
          *(uint *)((long)workSpace + uVar19 * 4 + 0x2a8) = uVar7 + 1;
          *(char *)((long)workSpace + (ulong)uVar7 + 0x2e0) = (char)uVar18;
        }
        if (tableLog_00 == 0xc && tableLog < 0xc) {
          tableLog_00 = 0xb;
        }
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        iVar6 = tableLog_00 - tableLog;
        iVar8 = 0;
        for (uVar18 = 1; uVar18 < uVar15; uVar18 = uVar18 + 1) {
          iVar4 = *(int *)((long)workSpace + uVar18 * 4 + 0x270);
          bVar5 = (byte)iVar6;
          *(int *)((long)workSpace + uVar18 * 4) = iVar8;
          iVar6 = iVar6 + 1;
          iVar8 = (iVar4 << (bVar5 & 0x1f)) + iVar8;
        }
        lVar12 = (ulong)uVar17 * 0x34;
        for (uVar7 = uVar17; uVar18 = 1, uVar7 < (tableLog_00 - uVar17) + 1; uVar7 = uVar7 + 1) {
          for (; uVar18 < uVar15; uVar18 = uVar18 + 1) {
            *(uint *)((long)workSpace + uVar18 * 4 + lVar12) =
                 *(uint *)((long)workSpace + uVar18 * 4) >> ((byte)uVar7 & 0x1f);
          }
          lVar12 = lVar12 + 0x34;
        }
        local_88 = (ulong)((tableLog + 1) - tableLog_00);
        local_38 = (long)(int)uVar9;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        local_80 = (ulong)(iVar11 + 1);
        local_70 = DTable + 7;
        local_e0 = tableLog * 2 + 1;
        iVar8 = local_e0 - tableLog_00;
        uVar15 = 1;
        local_a8 = DTable;
        while( true ) {
          iVar11 = 1;
          if (1 < iVar8) {
            iVar11 = iVar8;
          }
          if (uVar15 == local_80) break;
          lVar12 = (long)*(int *)((long)workSpace + uVar15 * 4 + 0x2a4);
          lVar13 = (long)*(int *)((long)workSpace + uVar15 * 4 + 0x2a8);
          uVar9 = (tableLog + 1) - (int)uVar15;
          uVar18 = (ulong)*(uint *)((long)workSpace + uVar15 * 4);
          if (tableLog_00 - uVar9 < uVar17) {
            HUF_fillDTableX2ForWeight
                      ((HUF_DEltX2 *)(local_a0 + uVar18),
                       (sortedSymbol_t *)((long)workSpace + lVar12 + 0x2e0),
                       (sortedSymbol_t *)((long)workSpace + lVar13 + 0x2e0),uVar9,tableLog_00,0,1);
          }
          else {
            lVar16 = local_78 * 0x34;
            uVar20 = tableLog_00 - uVar9 & 0x1f;
            local_98 = 1;
            uVar21 = 1 << (sbyte)uVar20;
            UVar10 = local_e0 - iVar11;
            uVar7 = (int)local_88 + uVar9;
            if (1 < (int)uVar7) {
              local_98 = (ulong)uVar7;
            }
            local_60 = (void *)((ulong)uVar9 * 0x34 + (long)workSpace);
            local_68 = (ulong)(uVar9 * 0x10000 + 0x1000000);
            local_58 = lVar13;
            local_50 = uVar15;
            while (uVar15 = local_50, lVar12 != local_58) {
              lVar13 = (long)(int)uVar18;
              pHVar2 = local_a0 + lVar13;
              bVar5 = *(byte *)((long)workSpace + lVar12 + 0x2e0);
              uVar15 = local_98;
              nbBits = UVar10;
              local_48 = uVar18;
              local_40 = lVar12;
              if (1 < (int)uVar7) {
                if (uVar20 == 0) {
                  __assert_fail("length > 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                                ,0x407,
                                "void HUF_fillDTableX2Level2(HUF_DEltX2 *, U32, const U32, const U32 *, const int, const int, const sortedSymbol_t *, const U32 *, U32, U16)"
                               );
                }
                uVar9 = *(uint *)((long)local_60 + local_98 * 4);
                if (uVar21 <= uVar9) {
                  __assert_fail("(U32)skipSize < length",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                                ,0x408,
                                "void HUF_fillDTableX2Level2(HUF_DEltX2 *, U32, const U32, const U32 *, const int, const int, const sortedSymbol_t *, const U32 *, U32, U16)"
                               );
                }
                lVar12 = (ulong)((uint)local_68 | (uint)bVar5) * 0x100000001;
                if (uVar21 == 2) {
                  pHVar14 = pHVar2;
                  if (uVar9 != 1) {
                    __assert_fail("skipSize == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                                  ,0x40b,
                                  "void HUF_fillDTableX2Level2(HUF_DEltX2 *, U32, const U32, const U32 *, const int, const int, const sortedSymbol_t *, const U32 *, U32, U16)"
                                 );
                  }
                }
                else {
                  if (uVar21 != 4) {
                    for (uVar18 = 0; uVar18 < uVar9; uVar18 = uVar18 + 8) {
                      *(long *)(local_70 + lVar13 + (uVar18 - 6)) = lVar12;
                      *(long *)(local_70 + lVar13 + (uVar18 - 4)) = lVar12;
                      *(long *)(local_70 + lVar13 + (uVar18 - 2)) = lVar12;
                      *(long *)(local_70 + lVar13 + uVar18) = lVar12;
                    }
                    goto LAB_001fba31;
                  }
                  *(long *)pHVar2 = lVar12;
                  pHVar14 = pHVar2 + 2;
                }
                *(long *)pHVar14 = lVar12;
              }
LAB_001fba31:
              for (; (long)uVar15 < local_38; uVar15 = uVar15 + 1) {
                HUF_fillDTableX2ForWeight
                          ((HUF_DEltX2 *)(pHVar2 + *(uint *)((long)workSpace + uVar15 * 4 + lVar16))
                           ,(sortedSymbol_t *)
                            ((long)workSpace +
                            (long)*(int *)((long)workSpace + uVar15 * 4 + 0x2a4) + 0x2e0),
                           (sortedSymbol_t *)
                           ((long)workSpace +
                           (long)*(int *)((long)workSpace + uVar15 * 4 + 0x2a8) + 0x2e0),nbBits,
                           tableLog_00,(ushort)bVar5,2);
                nbBits = nbBits - 1;
              }
              uVar18 = (ulong)((int)local_48 + uVar21);
              lVar12 = local_40 + 1;
            }
          }
          uVar15 = uVar15 + 1;
          local_78 = (ulong)((int)local_78 - 1);
          local_e0 = local_e0 + -1;
          iVar8 = iVar8 + -1;
        }
        *(char *)local_a8 = (char)uVar3;
        *(undefined1 *)((long)local_a8 + 1) = 1;
        *(char *)((long)local_a8 + 2) = (char)tableLog_00;
        *(char *)((long)local_a8 + 3) = (char)(uVar3 >> 0x18);
        sVar22 = local_90;
      }
    }
  }
  return sVar22;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog, maxW, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), flags);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */
    if (tableLog <= HUF_DECODER_FAST_TABLELOG && maxTableLog > HUF_DECODER_FAST_TABLELOG) maxTableLog = HUF_DECODER_FAST_TABLELOG;

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        rankStart[maxW+1] = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}